

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

double sampleSimplex2D(PerlinNoise *noise,double x,double y)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  double dVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double z;
  double d;
  double d_00;
  double x_00;
  double dStack_60;
  
  dVar8 = (x + y) * 0.3660254037844386;
  auVar3._8_4_ = SUB84(y,0);
  auVar3._0_8_ = x;
  auVar3._12_4_ = (int)((ulong)y >> 0x20);
  dVar9 = floor(dVar8 + x);
  dVar8 = floor(dVar8 + y);
  dStack_60 = auVar3._8_8_;
  iVar6 = (int)dVar9;
  uVar7 = (uint)dVar8;
  dVar9 = (double)(int)(iVar6 + uVar7) * 0.21132486540518713;
  x_00 = x - ((double)iVar6 - dVar9);
  dStack_60 = dStack_60 - ((double)(int)uVar7 - dVar9);
  dVar9 = 1.0;
  dVar8 = 1.0;
  if (x_00 <= dStack_60) {
    dVar8 = 0.0;
  }
  if (dStack_60 < x_00) {
    dVar9 = 0.0;
  }
  z = 0.42264973081037427;
  d = dStack_60 + -1.0 + 0.42264973081037427;
  cVar5 = (char)iVar6;
  bVar1 = noise->d[(byte)((dStack_60 < x_00) + cVar5 + noise->d[(x_00 <= dStack_60) + uVar7 & 0xff])
                  ];
  bVar2 = noise->d[(byte)(noise->d[uVar7 + 1 & 0xff] + cVar5 + 1)];
  d_00 = d;
  dVar4 = simplexGrad((uint)(noise->d[(byte)(noise->d[uVar7 & 0xff] + cVar5)] % 0xc),x_00,dStack_60,
                      0.42264973081037427,d);
  dVar9 = simplexGrad((uint)(bVar1 % 0xc),(x_00 - dVar8) + 0.21132486540518713,
                      (dStack_60 - dVar9) + 0.21132486540518713,z,d_00);
  dVar8 = simplexGrad((uint)(bVar2 % 0xc),x_00 + -1.0 + 0.42264973081037427,d,z,d_00);
  return (dVar8 + dVar9 + dVar4 + 0.0) * 70.0;
}

Assistant:

double sampleSimplex2D(const PerlinNoise *noise, double x, double y)
{
    const double SKEW = 0.5 * (sqrt(3) - 1.0);
    const double UNSKEW = (3.0 - sqrt(3)) / 6.0;

    double hf = (x + y) * SKEW;
    int hx = (int)floor(x + hf);
    int hz = (int)floor(y + hf);
    double mhxz = (hx + hz) * UNSKEW;
    double x0 = x - (hx - mhxz);
    double y0 = y - (hz - mhxz);
    int offx = (x0 > y0);
    int offz = !offx;
    double x1 = x0 - offx + UNSKEW;
    double y1 = y0 - offz + UNSKEW;
    double x2 = x0 - 1.0 + 2.0 * UNSKEW;
    double y2 = y0 - 1.0 + 2.0 * UNSKEW;
    int gi0 = noise->d[0xff & (hz)];
    int gi1 = noise->d[0xff & (hz + offz)];
    int gi2 = noise->d[0xff & (hz + 1)];
    gi0 = noise->d[0xff & (gi0 + hx)];
    gi1 = noise->d[0xff & (gi1 + hx + offx)];
    gi2 = noise->d[0xff & (gi2 + hx + 1)];
    double t = 0;
    t += simplexGrad(gi0 % 12, x0, y0, 0.0, 0.5);
    t += simplexGrad(gi1 % 12, x1, y1, 0.0, 0.5);
    t += simplexGrad(gi2 % 12, x2, y2, 0.0, 0.5);
    return 70.0 * t;
}